

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

int __thiscall re2::Regexp::Ref(Regexp *this)

{
  uint *puVar1;
  Regexp *local_28;
  MutexLock local_20;
  MutexLock l;
  Regexp *this_local;
  
  if (this->ref_ < 0xffff) {
    this_local._4_4_ = (uint)this->ref_;
  }
  else {
    l.mu_ = (Mutex *)this;
    MutexLock::MutexLock(&local_20,ref_mutex);
    local_28 = this;
    puVar1 = (uint *)std::
                     map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                     ::operator[](ref_map,&local_28);
    this_local._4_4_ = *puVar1;
    MutexLock::~MutexLock(&local_20);
  }
  return this_local._4_4_;
}

Assistant:

int Regexp::Ref() {
  if (ref_ < kMaxRef)
    return ref_;

  MutexLock l(ref_mutex);
  return (*ref_map)[this];
}